

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc-type-utils.h
# Opt level: O2

optional<wasm::Field> *
wasm::GCTypeUtils::getField(optional<wasm::Field> *__return_storage_ptr__,HeapType type,Index index)

{
  uintptr_t *puVar1;
  uintptr_t uVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  HeapType type_local;
  
  iVar4 = ::wasm::HeapType::getKind();
  if (iVar4 == 3) {
    ::wasm::HeapType::getArray();
  }
  else {
    if (iVar4 != 2) {
      bVar3 = false;
      goto LAB_001b06b8;
    }
    plVar5 = (long *)::wasm::HeapType::getStruct();
    puVar1 = (uintptr_t *)(*plVar5 + (ulong)index * 0x10);
    uVar2 = puVar1[1];
    (__return_storage_ptr__->super__Optional_base<wasm::Field,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Field>._M_payload._M_value.type.id = *puVar1;
    *(uintptr_t *)
     ((long)&(__return_storage_ptr__->super__Optional_base<wasm::Field,_true,_true>)._M_payload.
             super__Optional_payload_base<wasm::Field>._M_payload + 8) = uVar2;
  }
  bVar3 = true;
LAB_001b06b8:
  (__return_storage_ptr__->super__Optional_base<wasm::Field,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::Field>._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

inline std::optional<Field> getField(HeapType type, Index index = 0) {
  switch (type.getKind()) {
    case HeapTypeKind::Struct:
      return type.getStruct().fields[index];
    case HeapTypeKind::Array:
      return type.getArray().element;
    case HeapTypeKind::Func:
    case HeapTypeKind::Cont:
    case HeapTypeKind::Basic:
      break;
  }
  return {};
}